

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool sf::Shader::isAvailable(void)

{
  TransientContextLock contextLock;
  Lock lock;
  undefined2 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe2;
  byte bVar1;
  undefined1 in_stack_ffffffffffffffe3;
  undefined4 in_stack_ffffffffffffffe4;
  Mutex *in_stack_ffffffffffffffe8;
  TransientContextLock *in_stack_fffffffffffffff0;
  
  Lock::Lock((Lock *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  if ((isAvailable::checked & 1U) == 0) {
    isAvailable::checked = true;
    GlResource::TransientContextLock::TransientContextLock(in_stack_fffffffffffffff0);
    priv::ensureExtensionsInit();
    isAvailable::available = false;
    if ((((sfogl_ext_ARB_multitexture != 0) &&
         (isAvailable::available = false, sfogl_ext_ARB_shading_language_100 != 0)) &&
        (isAvailable::available = false, sfogl_ext_ARB_shader_objects != 0)) &&
       (isAvailable::available = false, sfogl_ext_ARB_vertex_shader != 0)) {
      isAvailable::available = sfogl_ext_ARB_fragment_shader != 0;
    }
    in_stack_ffffffffffffffe3 = isAvailable::available;
    GlResource::TransientContextLock::~TransientContextLock
              ((TransientContextLock *)
               CONCAT44(in_stack_ffffffffffffffe4,
                        CONCAT13(isAvailable::available,
                                 CONCAT12(in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0))));
  }
  bVar1 = isAvailable::available;
  Lock::~Lock((Lock *)CONCAT44(in_stack_ffffffffffffffe4,
                               CONCAT13(in_stack_ffffffffffffffe3,
                                        CONCAT12(isAvailable::available,in_stack_ffffffffffffffe0)))
             );
  return (bool)(bVar1 & 1);
}

Assistant:

bool Shader::isAvailable()
{
    Lock lock(isAvailableMutex);

    static bool checked = false;
    static bool available = false;

    if (!checked)
    {
        checked = true;

        TransientContextLock contextLock;

        // Make sure that extensions are initialized
        sf::priv::ensureExtensionsInit();

        available = GLEXT_multitexture         &&
                    GLEXT_shading_language_100 &&
                    GLEXT_shader_objects       &&
                    GLEXT_vertex_shader        &&
                    GLEXT_fragment_shader;
    }

    return available;
}